

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.h
# Opt level: O1

bool __thiscall llvm::DWARFDebugLine::Prologue::hasFileAtIndex(Prologue *this,uint64_t FileIndex)

{
  ushort uVar1;
  ulong uVar2;
  
  uVar1 = (this->FormParams).Version;
  if (uVar1 == 0) {
    __assert_fail("DwarfVersion != 0 && \"line table prologue has no dwarf version information\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                  ,0x47,"bool llvm::DWARFDebugLine::Prologue::hasFileAtIndex(uint64_t) const");
  }
  if (4 < uVar1) {
    uVar2 = ((long)(this->FileNames).
                   super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->FileNames).
                   super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f;
    return FileIndex <= uVar2 && uVar2 - FileIndex != 0;
  }
  if (FileIndex != 0) {
    return FileIndex <=
           (ulong)(((long)(this->FileNames).
                          super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->FileNames).
                          super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f);
  }
  return false;
}

Assistant:

uint16_t getVersion() const { return FormParams.Version; }